

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

int __thiscall FBlockLinesIterator::init(FBlockLinesIterator *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  int extraout_EAX;
  double dVar2;
  double dVar3;
  
  validcount = validcount + 1;
  dVar1 = *(double *)(ctx + 0x18) - bmaporgx;
  dVar2 = *(double *)ctx - bmaporgy;
  dVar3 = *(double *)(ctx + 8) - bmaporgy;
  this->minx = (int)((*(double *)(ctx + 0x10) - bmaporgx) * 0.0078125);
  this->maxx = (int)(dVar1 * 0.0078125);
  this->miny = (int)(dVar3 * 0.0078125);
  this->maxy = (int)(dVar2 * 0.0078125);
  Reset(this);
  return extraout_EAX;
}

Assistant:

void FBlockLinesIterator::init(const FBoundingBox &box)
{
	validcount++;
	maxy = GetBlockY(box.Top());
	miny = GetBlockY(box.Bottom());
	maxx = GetBlockX(box.Right());
	minx = GetBlockX(box.Left());
	Reset();
}